

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O2

void __thiscall Unowned_Compare_Test::TestBody(Unowned_Compare_Test *this)

{
  int *lhs;
  int *rhs;
  char *pcVar1;
  unowned_ptr<int> pI2Twin;
  unowned_ptr<int> pI2;
  AssertionResult gtest_ar;
  unowned_ptr<int> pI2Copy;
  AssertHelper local_48;
  unowned_ptr<int> pI;
  AssertHelper local_38;
  unowned_ptr<int> local_30;
  int i2;
  int i;
  unowned_ptr<int> pNone2;
  
  i = 5;
  local_30._p = (int *)0x0;
  pNone2._p = (int *)0x0;
  pI._p = &i;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"pNone","pNone2",&local_30,&pNone2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,(Message *)&pI2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"pI","pNone",&pI,&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,(Message *)&pI2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ
            ((internal *)&gtest_ar,"pNone","{}",(ulong)(local_30._p != (int *)0x0),0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,(Message *)&pI2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pI2._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((internal *)&gtest_ar,"pNone","nullptr",&local_30,&pI2._p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x40,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,(Message *)&pI2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pI2._p = &i;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            ((internal *)&gtest_ar,"pI","&i",&pI,&pI2._p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x41,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,(Message *)&pI2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  i2 = 5;
  pI2._p = &i2;
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"pI","pI2",&pI,&pI2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2Twin);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x45,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Copy,(Message *)&pI2Twin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Copy);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2Twin);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lhs = cgs::unowned_ptr<int>::operator*(&pI);
  rhs = cgs::unowned_ptr<int>::operator*(&pI2);
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"*pI","*pI2",lhs,rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2Twin);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Copy,(Message *)&pI2Twin);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Copy);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2Twin);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pI2Twin._p = &i2;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"pI2","pI2Twin",&pI2,&pI2Twin);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pI2Copy);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x48,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&pI2Copy);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pI2Copy);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pI2Copy = pI2;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"pI2","pI2Copy",&pI2,&pI2Copy);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Unowned, Compare)
{
    int i = 5;
    unowned_ptr<int> pI { &i };
    unowned_ptr<int> pNone {};
    unowned_ptr<int> pNone2 {nullptr};
    EXPECT_EQ(pNone, pNone2);
    EXPECT_NE(pI, pNone);
    EXPECT_EQ(pNone, {});
    EXPECT_EQ(pNone, nullptr);
    EXPECT_EQ(pI, &i);

    int i2 = 5;
    unowned_ptr<int> pI2 { &i2 };
    EXPECT_NE(pI, pI2);
    EXPECT_EQ(*pI, *pI2);
    unowned_ptr<int> pI2Twin { &i2 };
    EXPECT_EQ(pI2, pI2Twin);
    unowned_ptr<int> pI2Copy { pI2 };
    EXPECT_EQ(pI2, pI2Copy);
}